

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_dr_flac *
ma_dr_flac_open_memory(void *pData,size_t dataSize,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_dr_flac_read_proc in_RSI;
  ma_dr_flac_seek_proc in_RDI;
  ma_dr_flac_oggbs *oggbs;
  ma_dr_flac *pFlac;
  ma_dr_flac__memory_stream memoryStream;
  ma_allocation_callbacks *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  ma_dr_flac *local_8;
  
  local_8 = ma_dr_flac_open(in_RSI,in_RDI,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (local_8 == (ma_dr_flac *)0x0) {
    local_8 = (ma_dr_flac *)0x0;
  }
  else {
    (local_8->memoryStream).data = (ma_uint8 *)in_RDI;
    (local_8->memoryStream).dataSize = (size_t)in_RSI;
    (local_8->memoryStream).currentReadPos = 0;
    if (local_8->container == ma_dr_flac_container_ogg) {
      *(ma_dr_flac__memory_stream **)((long)local_8->_oggbs + 0x10) = &local_8->memoryStream;
    }
    else {
      (local_8->bs).pUserData = &local_8->memoryStream;
    }
  }
  return local_8;
}

Assistant:

MA_API ma_dr_flac* ma_dr_flac_open_memory(const void* pData, size_t dataSize, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac__memory_stream memoryStream;
    ma_dr_flac* pFlac;
    memoryStream.data = (const ma_uint8*)pData;
    memoryStream.dataSize = dataSize;
    memoryStream.currentReadPos = 0;
    pFlac = ma_dr_flac_open(ma_dr_flac__on_read_memory, ma_dr_flac__on_seek_memory, &memoryStream, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    pFlac->memoryStream = memoryStream;
#ifndef MA_DR_FLAC_NO_OGG
    if (pFlac->container == ma_dr_flac_container_ogg)
    {
        ma_dr_flac_oggbs* oggbs = (ma_dr_flac_oggbs*)pFlac->_oggbs;
        oggbs->pUserData = &pFlac->memoryStream;
    }
    else
#endif
    {
        pFlac->bs.pUserData = &pFlac->memoryStream;
    }
    return pFlac;
}